

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Element __thiscall ftxui::bgcolor(ftxui *this,Color color,Element *child)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Element EVar1;
  shared_ptr<ftxui::(anonymous_namespace)::BgColor> local_30;
  Element *local_20;
  Element *child_local;
  ftxui *pfStack_10;
  Color color_local;
  
  local_20 = child;
  child_local._4_4_ = color;
  pfStack_10 = this;
  std::make_shared<ftxui::(anonymous_namespace)::BgColor,std::shared_ptr<ftxui::Node>,ftxui::Color&>
            ((shared_ptr<ftxui::Node> *)&local_30,(Color *)child);
  std::shared_ptr<ftxui::Node>::shared_ptr<ftxui::(anonymous_namespace)::BgColor,void>
            ((shared_ptr<ftxui::Node> *)this,&local_30);
  std::shared_ptr<ftxui::(anonymous_namespace)::BgColor>::~shared_ptr(&local_30);
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar1.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element bgcolor(Color color, Element child) {
  return std::make_shared<BgColor>(std::move(child), color);
}